

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindowPrivate::initOperationMap(QMdiSubWindowPrivate *this)

{
  OperationInfoMap *this_00;
  long in_FS_OFFSET;
  Operation local_4c;
  OperationInfo local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->operationMap;
  local_4c = Move;
  local_48.changeFlags = 3;
  local_48.cursorShape = ArrowCursor;
  QRegion::QRegion(&local_48.region);
  local_48.hover = false;
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            (this_00,&local_4c,&local_48);
  QRegion::~QRegion(&local_48.region);
  local_4c = TopResize;
  local_48.changeFlags = 0x2a;
  local_48.cursorShape = SizeVerCursor;
  QRegion::QRegion(&local_48.region);
  local_48.hover = true;
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            (this_00,&local_4c,&local_48);
  QRegion::~QRegion(&local_48.region);
  local_4c = BottomResize;
  local_48.changeFlags = 8;
  local_48.cursorShape = SizeVerCursor;
  QRegion::QRegion(&local_48.region);
  local_48.hover = true;
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            (this_00,&local_4c,&local_48);
  QRegion::~QRegion(&local_48.region);
  local_4c = LeftResize;
  local_48.changeFlags = 0x15;
  local_48.cursorShape = SizeHorCursor;
  QRegion::QRegion(&local_48.region);
  local_48.hover = true;
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            (this_00,&local_4c,&local_48);
  QRegion::~QRegion(&local_48.region);
  local_4c = RightResize;
  local_48.changeFlags = 4;
  local_48.cursorShape = SizeHorCursor;
  QRegion::QRegion(&local_48.region);
  local_48.hover = true;
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            (this_00,&local_4c,&local_48);
  QRegion::~QRegion(&local_48.region);
  local_4c = TopLeftResize;
  local_48.changeFlags = 0x3f;
  local_48.cursorShape = SizeFDiagCursor;
  QRegion::QRegion(&local_48.region);
  local_48.hover = true;
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            (this_00,&local_4c,&local_48);
  QRegion::~QRegion(&local_48.region);
  local_4c = TopRightResize;
  local_48.changeFlags = 0x2e;
  local_48.cursorShape = SizeBDiagCursor;
  QRegion::QRegion(&local_48.region);
  local_48.hover = true;
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            (this_00,&local_4c,&local_48);
  QRegion::~QRegion(&local_48.region);
  local_4c = BottomLeftResize;
  local_48.changeFlags = 0x1d;
  local_48.cursorShape = SizeBDiagCursor;
  QRegion::QRegion(&local_48.region);
  local_48.hover = true;
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            (this_00,&local_4c,&local_48);
  QRegion::~QRegion(&local_48.region);
  local_4c = BottomRightResize;
  local_48.changeFlags = 0xc;
  local_48.cursorShape = SizeFDiagCursor;
  QRegion::QRegion(&local_48.region);
  local_48.hover = true;
  QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
            (this_00,&local_4c,&local_48);
  QRegion::~QRegion(&local_48.region);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::initOperationMap()
{
    operationMap.insert(Move, OperationInfo(HMove | VMove, Qt::ArrowCursor, false));
    operationMap.insert(TopResize, OperationInfo(VMove | VResize | VResizeReverse, Qt::SizeVerCursor));
    operationMap.insert(BottomResize, OperationInfo(VResize, Qt::SizeVerCursor));
    operationMap.insert(LeftResize, OperationInfo(HMove | HResize | HResizeReverse, Qt::SizeHorCursor));
    operationMap.insert(RightResize, OperationInfo(HResize, Qt::SizeHorCursor));
    operationMap.insert(TopLeftResize, OperationInfo(HMove | VMove | HResize | VResize | VResizeReverse
                                                     | HResizeReverse, Qt::SizeFDiagCursor));
    operationMap.insert(TopRightResize, OperationInfo(VMove | HResize | VResize
                                                      | VResizeReverse, Qt::SizeBDiagCursor));
    operationMap.insert(BottomLeftResize, OperationInfo(HMove | HResize | VResize | HResizeReverse,
                                                        Qt::SizeBDiagCursor));
    operationMap.insert(BottomRightResize, OperationInfo(HResize | VResize, Qt::SizeFDiagCursor));
}